

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionBody::SetReferencedPropertyIdWithMapIndex
          (FunctionBody *this,uint mapIndex,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  void *pvVar5;
  
  if (propertyId < 0x2d9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10fa,"(propertyId >= TotalNumberOfBuiltInProperties)",
                                "propertyId >= TotalNumberOfBuiltInProperties");
    if (!bVar2) goto LAB_00773ac4;
    *puVar4 = 0;
  }
  uVar3 = GetCountField(this,ReferencedPropertyIdCount);
  if (uVar3 <= mapIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10fb,"(mapIndex < this->GetReferencedPropertyIdCount())",
                                "mapIndex < this->GetReferencedPropertyIdCount()");
    if (!bVar2) goto LAB_00773ac4;
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,ReferencedPropertyIdMap);
  if (pvVar5 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10fc,"(this->GetReferencedPropertyIdMap() != nullptr)",
                                "this->GetReferencedPropertyIdMap() != nullptr");
    if (!bVar2) goto LAB_00773ac4;
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,ReferencedPropertyIdMap);
  if (*(int *)((long)pvVar5 + (ulong)mapIndex * 4) != -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10fd,
                                "(this->GetReferencedPropertyIdMap()[mapIndex] == Js::Constants::NoProperty)"
                                ,
                                "this->GetReferencedPropertyIdMap()[mapIndex] == Js::Constants::NoProperty"
                               );
    if (!bVar2) {
LAB_00773ac4:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  pvVar5 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,ReferencedPropertyIdMap);
  *(PropertyId *)((long)pvVar5 + (ulong)mapIndex * 4) = propertyId;
  return;
}

Assistant:

void FunctionBody::SetReferencedPropertyIdWithMapIndex(uint mapIndex, PropertyId propertyId)
    {
        Assert(propertyId >= TotalNumberOfBuiltInProperties);
        Assert(mapIndex < this->GetReferencedPropertyIdCount());
        Assert(this->GetReferencedPropertyIdMap() != nullptr);
        Assert(this->GetReferencedPropertyIdMap()[mapIndex] == Js::Constants::NoProperty);
        this->GetReferencedPropertyIdMap()[mapIndex] = propertyId;
    }